

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int CmdCommandEcho(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  
  Extra_UtilGetoptReset();
  bVar2 = false;
  do {
    bVar1 = bVar2;
    iVar3 = Extra_UtilGetopt(argc,argv,"hn");
    bVar2 = true;
  } while (iVar3 == 0x6e);
  if (iVar3 == -1) {
    lVar4 = (long)globalUtilOptind;
    if (pAbc->Out == _stdout) {
      if (globalUtilOptind < argc) {
        do {
          Abc_Print(1,"%s ",argv[lVar4]);
          lVar4 = lVar4 + 1;
        } while (argc != lVar4);
      }
      iVar3 = 0;
      if (!bVar1) {
        iVar3 = 0;
        Abc_Print(1,"\n");
      }
    }
    else {
      if (globalUtilOptind < argc) {
        do {
          fprintf((FILE *)pAbc->Out,"%s ",argv[lVar4]);
          lVar4 = lVar4 + 1;
        } while (argc != lVar4);
      }
      if (!bVar1) {
        fputc(10,(FILE *)pAbc->Out);
      }
      fflush((FILE *)pAbc->Out);
      iVar3 = 0;
    }
  }
  else {
    fwrite("usage: echo [-h] string \n",0x19,1,(FILE *)pAbc->Err);
    fwrite("   -n \t\tsuppress newline at the end\n",0x24,1,(FILE *)pAbc->Err);
    fwrite("   -h \t\tprint the command usage\n",0x20,1,(FILE *)pAbc->Err);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int CmdCommandEcho( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int i;
    int c;
    int n = 1;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "hn" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            n = 0;
            break;
        case 'h':
            goto usage;
            break;
        default:
            goto usage;
        }
    }

    if (pAbc->Out == stdout){
        for ( i = globalUtilOptind; i < argc; i++ )
            Abc_Print( 1, "%s ", argv[i] );
        if ( n )
            Abc_Print( 1, "\n" );

    }else{
        for ( i = globalUtilOptind; i < argc; i++ )
            fprintf( pAbc->Out, "%s ", argv[i] );
        if ( n )
            fprintf( pAbc->Out, "\n" );

        fflush ( pAbc->Out );
    }
    return 0;

  usage:
    fprintf( pAbc->Err, "usage: echo [-h] string \n" );
    fprintf( pAbc->Err, "   -n \t\tsuppress newline at the end\n" );
    fprintf( pAbc->Err, "   -h \t\tprint the command usage\n" );
    return ( 1 );
}